

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void roundFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uint uVar1;
  uint uVar2;
  Mem *pMVar3;
  ulong uVar4;
  char *__s;
  size_t sVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  double val;
  double local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (argc == 2) {
    pMVar3 = argv[1];
    uVar1._0_2_ = pMVar3->flags;
    uVar1._2_1_ = pMVar3->enc;
    uVar1._3_1_ = pMVar3->eSubtype;
    if ((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
      uVar4 = sqlite3VdbeIntValue(pMVar3);
      uVar6 = 0x1e;
      if ((long)uVar4 < 0x1e) {
        uVar6 = uVar4;
      }
      uVar4 = 0;
      if (0 < (long)uVar6) {
        uVar4 = uVar6;
      }
      goto LAB_001af27b;
    }
  }
  else {
    uVar4 = 0;
LAB_001af27b:
    pMVar3 = *argv;
    uVar2._0_2_ = pMVar3->flags;
    uVar2._2_1_ = pMVar3->enc;
    uVar2._3_1_ = pMVar3->eSubtype;
    if ((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
      local_30 = sqlite3VdbeRealValue(pMVar3);
      val = local_30;
      if (ABS(local_30) <= 4503599627370496.0) {
        if (uVar4 == 0) {
          val = (double)(long)(local_30 + *(double *)(&DAT_00208fe0 + (ulong)(local_30 < 0.0) * 8));
        }
        else {
          __s = sqlite3_mprintf("%!.*f",uVar4 & 0xffffffff);
          if (__s == (char *)0x0) {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
              sqlite3_result_error_nomem(context);
              return;
            }
            goto LAB_001af389;
          }
          sVar5 = strlen(__s);
          sqlite3AtoF(__s,&local_30,(uint)sVar5 & 0x3fffffff,'\x01');
          sqlite3_free(__s);
          val = local_30;
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        sqlite3VdbeMemSetDouble(context->pOut,val);
        return;
      }
      goto LAB_001af389;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_001af389:
  __stack_chk_fail();
}

Assistant:

static void roundFunc(sqlite3_context *context, int argc, sqlite3_value **argv){
  i64 n = 0;
  double r;
  char *zBuf;
  assert( argc==1 || argc==2 );
  if( argc==2 ){
    if( SQLITE_NULL==sqlite3_value_type(argv[1]) ) return;
    n = sqlite3_value_int64(argv[1]);
    if( n>30 ) n = 30;
    if( n<0 ) n = 0;
  }
  if( sqlite3_value_type(argv[0])==SQLITE_NULL ) return;
  r = sqlite3_value_double(argv[0]);
  /* If Y==0 and X will fit in a 64-bit int,
  ** handle the rounding directly,
  ** otherwise use printf.
  */
  if( r<-4503599627370496.0 || r>+4503599627370496.0 ){
    /* The value has no fractional part so there is nothing to round */
  }else if( n==0 ){
    r = (double)((sqlite_int64)(r+(r<0?-0.5:+0.5)));
  }else{
    zBuf = sqlite3_mprintf("%!.*f",(int)n,r);
    if( zBuf==0 ){
      sqlite3_result_error_nomem(context);
      return;
    }
    sqlite3AtoF(zBuf, &r, sqlite3Strlen30(zBuf), SQLITE_UTF8);
    sqlite3_free(zBuf);
  }
  sqlite3_result_double(context, r);
}